

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.cpp
# Opt level: O3

Error * __thiscall
ot::commissioner::coap::Coap::SendHeaderResponse
          (Error *__return_storage_ptr__,Coap *this,Code aCode,Request *aRequest)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  uint uVar3;
  char *from;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  char *to;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  format_args args;
  writer write;
  writer local_140;
  string local_138;
  undefined1 local_118 [8];
  _Alloc_hider local_110;
  size_type local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  parse_func local_f0 [1];
  ErrorCode local_e0;
  undefined1 *local_d8 [2];
  undefined1 local_c8 [16];
  Response local_b8;
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  local_b8.mOptions._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_b8.mOptions._M_t._M_impl.super__Rb_tree_header._M_header;
  local_b8.mOptions._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_b8.mOptions._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  paVar1 = &local_b8.mRequestUri.field_2;
  local_b8.mOptions._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_b8.mPayload.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.mPayload.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8.mPayload.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8.mRequestUri._M_string_length = 0;
  local_b8.mRequestUri.field_2._M_local_buf[0] = '\0';
  local_b8.mSubType = kNone;
  local_b8.mEndpoint = (Endpoint *)0x0;
  local_b8.mHeader._0_1_ = 1;
  local_b8.mHeader.mCode = '\0';
  local_b8.mHeader.mMessageId = 0;
  uVar3 = *(uint *)&aRequest->mHeader >> 2 & 3;
  local_b8.mOptions._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_b8.mOptions._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_b8.mRequestUri._M_dataplus._M_p = (pointer)paVar1;
  if (uVar3 == 1) {
    local_b8.mHeader.mCode = aCode;
    local_b8.mHeader._0_1_ = 5;
    local_b8.mHeader.mMessageId = (short)*(undefined4 *)&this->mMessageId + 1;
    this->mMessageId = local_b8.mHeader.mMessageId;
  }
  else {
    if (uVar3 != 0) {
      local_118._0_4_ = none_type;
      from = "a CoAP request is neither Confirmable nor NON-Confirmable";
      local_110._M_p = "a CoAP request is neither Confirmable nor NON-Confirmable";
      local_108 = 0x39;
      local_100._M_allocated_capacity = 0;
      local_f0[0] = (parse_func)0x0;
      local_140.handler_ = (format_string_checker<char> *)local_118;
      local_100._8_8_ = (format_string_checker<char> *)local_118;
      do {
        cVar2 = *from;
        to = from;
        while (cVar2 != '{') {
          to = to + 1;
          if (to == "") {
            ::fmt::v10::detail::
            parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer
            ::operator()(&local_140,from,"");
            goto LAB_0014d3da;
          }
          cVar2 = *to;
        }
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
        operator()(&local_140,from,to);
        from = ::fmt::v10::detail::
               parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                         (to,"",(format_string_checker<char> *)local_118);
      } while (from != "");
LAB_0014d3da:
      args.field_1.args_ = in_R9.args_;
      args.desc_ = (unsigned_long_long)local_118;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_138,(v10 *)"a CoAP request is neither Confirmable nor NON-Confirmable",
                 (string_view)ZEXT816(0x39),args);
      local_e0 = kInvalidArgs;
      local_d8[0] = local_c8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_d8,local_138._M_dataplus._M_p,
                 local_138._M_dataplus._M_p + local_138._M_string_length);
      __return_storage_ptr__->mCode = local_e0;
      std::__cxx11::string::operator=
                ((string *)&__return_storage_ptr__->mMessage,(string *)local_d8);
      if (local_d8[0] != local_c8) {
        operator_delete(local_d8[0]);
      }
      paVar4 = &local_138.field_2;
      goto LAB_0014d457;
    }
    local_b8.mHeader.mCode = aCode;
    local_b8.mHeader._0_1_ = 9;
    local_b8.mHeader.mMessageId = (aRequest->mHeader).mMessageId;
  }
  local_b8.mHeader._0_1_ = local_b8.mHeader._0_1_;
  local_b8.mHeader.mCode = local_b8.mHeader.mCode;
  SendResponse((Error *)local_118,this,aRequest,&local_b8);
  __return_storage_ptr__->mCode = local_118._0_4_;
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->mMessage,(string *)&local_110);
  paVar4 = &local_100;
  local_138._M_dataplus._M_p = local_110._M_p;
LAB_0014d457:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != paVar4) {
    operator_delete(local_138._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8.mRequestUri._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8.mRequestUri._M_dataplus._M_p);
  }
  if (local_b8.mPayload.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.mPayload.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<ot::commissioner::coap::OptionType,_std::pair<const_ot::commissioner::coap::OptionType,_ot::commissioner::coap::OptionValue>,_std::_Select1st<std::pair<const_ot::commissioner::coap::OptionType,_ot::commissioner::coap::OptionValue>_>,_std::less<ot::commissioner::coap::OptionType>,_std::allocator<std::pair<const_ot::commissioner::coap::OptionType,_ot::commissioner::coap::OptionValue>_>_>
  ::~_Rb_tree(&local_b8.mOptions._M_t);
  return __return_storage_ptr__;
}

Assistant:

Error Coap::SendHeaderResponse(Code aCode, const Request &aRequest)
{
    Error    error;
    Response response;

    switch (aRequest.GetType())
    {
    case Type::kConfirmable:
        response.SetType(Type::kAcknowledgment);
        response.SetCode(aCode);
        response.SetMessageId(aRequest.GetMessageId());
        break;

    case Type::kNonConfirmable:
        response.SetType(Type::kNonConfirmable);
        response.SetCode(aCode);
        response.SetMessageId(AllocMessageId());
        break;

    default:
        ExitNow(error = ERROR_INVALID_ARGS("a CoAP request is neither Confirmable nor NON-Confirmable"));
        break;
    }

    SuccessOrExit(error = SendResponse(aRequest, response));

exit:
    return error;
}